

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O2

int ssl_cert_add1_chain_cert(CERT *cert,X509 *x509)

{
  bool bVar1;
  int iVar2;
  UniquePtr<CRYPTO_BUFFER> buffer;
  UniquePtr<CRYPTO_BUFFER> local_20;
  
  if (cert->x509_method != (SSL_X509_METHOD *)0x0) {
    bssl::x509_to_buffer((bssl *)&buffer,x509);
    iVar2 = 0;
    if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
        buffer._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
      local_20 = (UniquePtr<CRYPTO_BUFFER>)
                 (UniquePtr<CRYPTO_BUFFER>)
                 buffer._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
      buffer._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0;
      bVar1 = ssl_credential_st::AppendIntermediateCert
                        ((cert->legacy_credential)._M_t.
                         super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl,&local_20);
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
      if (bVar1) {
        bssl::ssl_crypto_x509_cert_flush_cached_chain(cert);
        iVar2 = 1;
      }
    }
    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&buffer);
    return iVar2;
  }
  __assert_fail("cert->x509_method",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_x509.cc"
                ,0x27d,"int ssl_cert_add1_chain_cert(CERT *, X509 *)");
}

Assistant:

static int ssl_cert_add1_chain_cert(CERT *cert, X509 *x509) {
  assert(cert->x509_method);

  UniquePtr<CRYPTO_BUFFER> buffer = x509_to_buffer(x509);
  if (!buffer ||
      !cert->legacy_credential->AppendIntermediateCert(std::move(buffer))) {
    return 0;
  }

  ssl_crypto_x509_cert_flush_cached_chain(cert);
  return 1;
}